

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::GenerateCheckFixedFld(Lowerer *this,Instr *instrChkFld)

{
  InlineCacheIndex IVar1;
  SymOpnd *this_00;
  Type_conflict pBVar2;
  JitArenaAllocator *alloc;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  JITTimeFunctionBody *pJVar11;
  FunctionJITTimeInfo *pFVar12;
  undefined4 *puVar13;
  PropertySymOpnd *this_01;
  char16 *pcVar14;
  LabelInstr *labelBailOut;
  BVSparse<Memory::JitArenaAllocator> *pBVar15;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar16;
  char *this_02;
  Lowerer *this_03;
  WCHAR local_468 [4];
  WCHAR prefixValue [512];
  
  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(instrChkFld->m_func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
  pFVar12 = JITTimeWorkItem::GetJITTimeInfo(instrChkFld->m_func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FixedMethodsPhase,uVar8,uVar9);
  if (bVar4) {
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(instrChkFld->m_func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(instrChkFld->m_func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,UseFixedDataPropsPhase,uVar8,uVar9);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1894,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())))"
                         ,"Lowering a check fixed field with fixed data/method phase disabled?");
      if (!bVar4) goto LAB_0059a6bd;
      *puVar13 = 0;
    }
  }
  OVar5 = IR::Opnd::GetKind(instrChkFld->m_src1);
  if (OVar5 == OpndKindSym) {
    this_00 = (SymOpnd *)instrChkFld->m_src1;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_0059a6bd;
      *puVar13 = 0;
    }
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar4) goto LAB_00599f2f;
  }
  else {
LAB_00599f2f:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1896,
                       "(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                       ,
                       "instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                      );
    if (!bVar4) goto LAB_0059a6bd;
    *puVar13 = 0;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrChkFld->m_src1);
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if ((!bVar4) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1899,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar4) goto LAB_0059a6bd;
    *puVar13 = 0;
  }
  if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01), !bVar4 &&
      (((ushort)this_01->field_12 & 2) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189a,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar4) goto LAB_0059a6bd;
    *puVar13 = 0;
  }
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (((bVar4) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) &&
     (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189e,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar4) goto LAB_0059a6bd;
    *puVar13 = 0;
  }
  bVar4 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar6 = IR::PropertySymOpnd::NeedsCheckFixedFieldTypeCheck(this_01);
  if (bVar6) {
    bVar6 = true;
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
      if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) goto LAB_0059a108;
      bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01->objTypeSpecFldInfo);
    }
  }
  else {
LAB_0059a108:
    bVar6 = false;
  }
  if (((this_01->super_SymOpnd).m_sym)->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar7) goto LAB_0059a6bd;
    *puVar13 = 0;
  }
  IVar1 = this_01->m_inlineCacheIndex;
  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
  pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
  this_02 = &DAT_015b6718;
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar8,uVar9);
  if (bVar7) {
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetFunctionNumber(pJVar11);
    swprintf_s<512ul>((WCHAR (*) [512])local_468,L"%s (#%d.%u, #%u)",pcVar14,(ulong)uVar8,
                      (ulong)uVar9,(ulong)uVar10);
    Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode);
    if (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      for (pBVar2 = this_01->guardedPropOps->head; pBVar2 != (Type_conflict)0x0;
          pBVar2 = pBVar2->next) {
        BVUnitT<unsigned_long>::CountBit((pBVar2->data).word);
      }
    }
    this_02 = (char *)0x84;
    Output::TraceWithPrefix
              (ObjTypeSpecPhase,local_468,
               L"Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"
              );
  }
  if ((bVar4 | bVar6) == 1) {
    labelBailOut = IR::LabelInstr::New(Label,this->m_func,true);
    if (bVar6 != false) {
      if ((this_01->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
         (bVar4 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad
                            (this_01->objTypeSpecFldInfo), bVar4)) {
        pBVar15 = this_01->guardedPropOps;
        if (pBVar15 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          do {
            pBVar15 = (BVSparse<Memory::JitArenaAllocator> *)pBVar15->head;
            if (pBVar15 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0059a3b8;
          } while (((Type *)&pBVar15->alloc)->word == 0);
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x18bf,
                             "(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty())"
                             ,"This property Guard is used only for one property");
          if (!bVar4) goto LAB_0059a6bd;
          *puVar13 = 0;
        }
LAB_0059a3b8:
        bVar4 = GeneratePropertyGuardCheck(this,instrChkFld,this_01,labelBailOut);
        if (bVar4) goto LAB_0059a4de;
        goto LAB_0059a6a1;
      }
      if (this_01->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        alloc = this->m_func->m_alloc;
        pBVar15 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
        pBVar15->head = (Type_conflict)0x0;
        pBVar15->lastFoundIndex = (Type_conflict)0x0;
        pBVar15->alloc = alloc;
        pBVar15->lastUsedNodePrevNextField = (Type)pBVar15;
        this_01->guardedPropOps = pBVar15;
      }
      uVar8 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
      IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar8);
    }
    GenerateCachedTypeCheck(this,instrChkFld,this_01,labelBailOut,labelBailOut,(LabelInstr *)0x0);
LAB_0059a4de:
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrChkFld,&instr->super_Instr);
    IR::Instr::InsertBefore(instrChkFld,&labelBailOut->super_Instr);
    this_03 = (Lowerer *)instrChkFld;
    IR::Instr::InsertAfter(instrChkFld,&branchTarget->super_Instr);
    if (((ushort)this_01->field_12 & 8) != 0) {
      GenerateAuxSlotPtrLoad(this_03,this_01,(branchTarget->super_Instr).m_next);
    }
    if ((instrChkFld->field_0x38 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x190a,"(instrChkFld->HasBailOutInfo())","instrChkFld->HasBailOutInfo()");
      if (!bVar4) {
LAB_0059a6bd:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
    }
    pBVar16 = IR::Instr::GetBailOutInfo(instrChkFld);
    if (pBVar16->bailOutInstr != instrChkFld) {
      pBVar16 = IR::Instr::GetBailOutInfo(instrChkFld);
      pBVar16->polymorphicCacheIndex = IVar1;
    }
    IR::Instr::FreeSrc1(instrChkFld);
    instrChkFld->m_opcode = BailOut;
    GenerateBailOut(this,instrChkFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  else {
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0) {
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
      this_02 = &DAT_015a4e90;
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FixedFieldGuardCheckPhase,uVar8,uVar9);
      if (bVar4) {
        labelBailOut = (LabelInstr *)0x0;
        bVar4 = false;
      }
      else {
        labelBailOut = IR::LabelInstr::New(Label,this->m_func,true);
        this_02 = (char *)this;
        bVar4 = GeneratePropertyGuardCheck(this,instrChkFld,this_01,labelBailOut);
      }
    }
    else {
      labelBailOut = (LabelInstr *)0x0;
      bVar4 = false;
    }
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0) {
      if (bVar4 != false) goto LAB_0059a4de;
    }
    else {
      if (labelBailOut != (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        this_02 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
        ;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x18e7,"(labelBailOut == nullptr)","labelBailOut == nullptr");
        if (!bVar4) goto LAB_0059a6bd;
        *puVar13 = 0;
      }
      if ((instrChkFld->field_0x38 & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        this_02 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
        ;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x18e8,"(!instrChkFld->HasBailOutInfo())",
                           "Why does a direct fixed field check have bailout?");
        if (!bVar4) goto LAB_0059a6bd;
        *puVar13 = 0;
      }
      if (((ushort)this_01->field_12 & 8) != 0) {
        GenerateAuxSlotPtrLoad((Lowerer *)this_02,this_01,instrChkFld);
      }
    }
LAB_0059a6a1:
    IR::Instr::Remove(instrChkFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateCheckFixedFld(IR::Instr * instrChkFld)
{
    IR::Instr *instr;
    IR::LabelInstr *labelBailOut = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instrChkFld->m_func) ||
        !PHASE_OFF(Js::UseFixedDataPropsPhase, instrChkFld->m_func), "Lowering a check fixed field with fixed data/method phase disabled?");

    Assert(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkFld->GetSrc1()->AsPropertySymOpnd();

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    // For the non-configurable properties on the global object we do not need a type check.  Otherwise,
    // we need a type check and bailout here unless this operation is part of the type check sequence and
    // is protected by a type check upstream.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    // In addition, we may also need a local type check in case the property comes from the prototype and
    // it may have been overwritten on the instance after the primary type check upstream. If the property
    // comes from the instance, we must still protect against its value changing after the type check, but
    // for this a cheaper guard check is sufficient (see below).
    bool emitFixedFieldTypeCheck = propertySymOpnd->NeedsCheckFixedFieldTypeCheck() &&
        (!propertySymOpnd->IsTypeChecked() || propertySymOpnd->IsLoadedFromProto());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;
    bool checkFixedDataGenerated = false;
    bool checkFixedTypeGenerated = false;

    OUTPUT_TRACE_FUNC(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode),
        propertySym->m_propertyId,
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"),
        propertySymOpnd->GetGuardedPropOps() ? propertySymOpnd->GetGuardedPropOps()->Count() : 0);

    if (emitPrimaryTypeCheck || emitFixedFieldTypeCheck)
    {
        labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if(emitFixedFieldTypeCheck && propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())
        {
            AssertMsg(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty(), "This property Guard is used only for one property");
            //We need only cheaper Guard check, if the property belongs to the GlobalObject.
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
        else
        {
            if (emitFixedFieldTypeCheck)
            {
                propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
                propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
            }
            this->GenerateCachedTypeCheck(instrChkFld, propertySymOpnd, labelBailOut, labelBailOut);
            checkFixedTypeGenerated = true;
        }
    }

    // We may still need this guard if we didn't emit the write protect type check above. This situation arises if we have
    // a fixed field from the instance (not proto) and a property of the same name has been written somewhere between the
    // primary type check and here. Note that we don't need a type check, because we know the fixed field exists on the
    // object even if it has been written since primary type check, but we need to verify the fixed value didn't get overwritten.
    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && !propertySymOpnd->IsWriteGuardChecked())
    {
        if (!PHASE_OFF(Js::FixedFieldGuardCheckPhase, this->m_func))
        {
            Assert(labelBailOut == nullptr);
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
    }

    // Note that a type handler holds only a weak reference to the singleton instance it represents, so
    // it is possible that the instance gets collected before the type and handler do. Hence, the upstream
    // type check may succeed, even as the original instance no longer exists. However, this would happen
    // only if another instance reached the same type (otherwise we wouldn't ever pass the type check
    // upstream). In that case we would have invalidated all fixed fields on that type, and so the type
    // check (or property guard check, if necessary) above would fail. All in all, we would never attempt
    // to access a fixed field from an instance that has been collected.

    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && propertySymOpnd->IsWriteGuardChecked())
    {
        Assert(labelBailOut == nullptr);
        AssertMsg(!instrChkFld->HasBailOutInfo(), "Why does a direct fixed field check have bailout?");
        if (propertySymOpnd->ProducesAuxSlotPtr())
        {
            this->GenerateAuxSlotPtrLoad(propertySymOpnd, instrChkFld);
        }
        instrChkFld->Remove();
        return true;
    }

    // With lazy bailout, no checks might be generated for CheckFixedFld, so the code in Lowerer is only an
    // unconditional jmp to get past the bailout helper block. This is a new case and is unexpected, so layout
    // phase will also move the statement boundary preceding CheckFixedFld together with the jmp to after
    // function exit. As a result, source mapping is incorrect. Make sure that this doesn't happen by not
    // generating helper blocks at all if we don't generate checks.
    if (!checkFixedDataGenerated && !checkFixedTypeGenerated)
    {
        instrChkFld->Remove();
        return true;
    }

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkFld->InsertBefore(instr);

    // Insert the helper label here.
    instrChkFld->InsertBefore(labelBailOut);
    instrChkFld->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkFld->HasBailOutInfo());

    if (instrChkFld->GetBailOutInfo()->bailOutInstr != instrChkFld)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkFld->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkFld->FreeSrc1();
    instrChkFld->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkFld);

    return true;
}